

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

bool WScriptJsrt::Uninitialize(void)

{
  RuntimeThreadData *pRVar1;
  bool bVar2;
  RuntimeThreadLocalData *pRVar3;
  size_type sVar4;
  reference lpHandles;
  PAL_FILE *pPVar5;
  reference ppRVar6;
  _Self local_78;
  _Self local_70;
  iterator i_1;
  DWORD waitRet;
  RuntimeThreadData *child;
  _Self local_38;
  iterator i;
  vector<void_*,_std::allocator<void_*>_> childrenHandles;
  LONG count;
  RuntimeThreadData **threadData;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
  ::clear(&moduleRecordMap_abi_cxx11_);
  std::
  map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&moduleDirMap_abi_cxx11_);
  std::
  map<void_*,_ModuleState,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ModuleState>_>_>
  ::clear(&moduleErrMap);
  std::
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&scriptDirMap_abi_cxx11_);
  pRVar3 = GetRuntimeThreadLocalData();
  if (pRVar3->threadData != (RuntimeThreadData *)0x0) {
    bVar2 = std::__cxx11::list<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>::empty
                      (&pRVar3->threadData->children);
    if (!bVar2) {
      sVar4 = std::__cxx11::list<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>::size
                        (&pRVar3->threadData->children);
      std::vector<void_*,_std::allocator<void_*>_>::vector
                ((vector<void_*,_std::allocator<void_*>_> *)&i);
      local_38._M_node =
           (_List_node_base *)
           std::__cxx11::list<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>::begin
                     (&pRVar3->threadData->children);
      while( true ) {
        child = (RuntimeThreadData *)
                std::__cxx11::list<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>::end
                          (&pRVar3->threadData->children);
        bVar2 = std::operator!=(&local_38,(_Self *)&child);
        if (!bVar2) break;
        ppRVar6 = std::_List_iterator<RuntimeThreadData_*>::operator*(&local_38);
        pRVar1 = *ppRVar6;
        std::vector<void_*,_std::allocator<void_*>_>::push_back
                  ((vector<void_*,_std::allocator<void_*>_> *)&i,&pRVar1->hThread);
        SetEvent(pRVar1->hevntShutdown);
        std::_List_iterator<RuntimeThreadData_*>::operator++(&local_38,0);
      }
      lpHandles = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                            ((vector<void_*,_std::allocator<void_*>_> *)&i,0);
      i_1._M_node._4_4_ = WaitForMultipleObjects((DWORD)sVar4,lpHandles,1,0xffffffff);
      if (i_1._M_node._4_4_ != 0) {
        pPVar5 = PAL_get_stderr(0);
        PAL_fprintf(pPVar5,"ASSERTION (%s, line %d) %s %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/WScriptJsrt.cpp"
                    ,0x4fd,"waitRet == 0","waitRet == WAIT_OBJECT_0");
        pPVar5 = PAL_get_stderr(0);
        PAL_fflush(pPVar5);
        DebugBreak();
      }
      local_70._M_node =
           (_List_node_base *)
           std::__cxx11::list<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>::begin
                     (&pRVar3->threadData->children);
      while( true ) {
        local_78._M_node =
             (_List_node_base *)
             std::__cxx11::list<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>::end
                       (&pRVar3->threadData->children);
        bVar2 = std::operator!=(&local_70,&local_78);
        if (!bVar2) break;
        ppRVar6 = std::_List_iterator<RuntimeThreadData_*>::operator*(&local_70);
        pRVar1 = *ppRVar6;
        if (pRVar1 != (RuntimeThreadData *)0x0) {
          RuntimeThreadData::~RuntimeThreadData(pRVar1);
          operator_delete(pRVar1);
        }
        std::_List_iterator<RuntimeThreadData_*>::operator++(&local_70,0);
      }
      std::__cxx11::list<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>::clear
                (&pRVar3->threadData->children);
      std::vector<void_*,_std::allocator<void_*>_>::~vector
                ((vector<void_*,_std::allocator<void_*>_> *)&i);
    }
  }
  return true;
}

Assistant:

bool WScriptJsrt::Uninitialize()
{
    // moduleRecordMap is a global std::map, its destructor may access overridden
    // "operator delete" / global HeapAllocator::Instance. Clear it manually here
    // to avoid worrying about global destructor order.
    moduleRecordMap.clear();
    moduleDirMap.clear();
    moduleErrMap.clear();
    scriptDirMap.clear();

    auto& threadData = GetRuntimeThreadLocalData().threadData;
    if (threadData && !threadData->children.empty())
    {
        LONG count = (LONG)threadData->children.size();
        std::vector<HANDLE> childrenHandles;

        //Clang does not support "for each" yet
        for(auto i = threadData->children.begin(); i!= threadData->children.end(); i++)
        {
            auto child = *i;
            childrenHandles.push_back(child->hThread);
            SetEvent(child->hevntShutdown);
        }

        DWORD waitRet = WaitForMultipleObjects(count, &childrenHandles[0], TRUE, INFINITE);
        Assert(waitRet == WAIT_OBJECT_0);

        for (auto i = threadData->children.begin(); i != threadData->children.end(); i++)
        {
            delete *i;
        }

        threadData->children.clear();
    }

    return true;
}